

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O3

void olsrv2_routing_domain_changed(nhdp_domain *domain,_Bool autoupdate_ansn)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  
  _update_ansn = _update_ansn || autoupdate_ansn;
  if (domain == (nhdp_domain *)0x0) {
    plVar2 = (long *)nhdp_domain_get_list();
    plVar2 = (long *)*plVar2;
    lVar1 = plVar2[1];
    lVar3 = nhdp_domain_get_list();
    if (lVar1 != *(long *)(lVar3 + 8)) {
      do {
        _domain_changed[*(int *)((long)plVar2 + -0x26c)] = true;
        olsrv2_routing_trigger_update();
        plVar2 = (long *)*plVar2;
        lVar1 = plVar2[1];
        lVar3 = nhdp_domain_get_list();
      } while (lVar1 != *(long *)(lVar3 + 8));
    }
    return;
  }
  _domain_changed[domain->index] = true;
  olsrv2_routing_trigger_update();
  return;
}

Assistant:

void
olsrv2_routing_domain_changed(struct nhdp_domain *domain, bool autoupdate_ansn) {
  _update_ansn |= autoupdate_ansn;
  if (domain) {
    _domain_changed[domain->index] = true;

    olsrv2_routing_trigger_update();
    return;
  }

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    olsrv2_routing_domain_changed(domain, false);
  }
}